

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::removeOuterParenthesis(string *ustring)

{
  string *psVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  ulong local_38;
  size_t ii;
  undefined8 uStack_28;
  int open;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  string *local_10;
  string *ustring_local;
  
  local_10 = ustring;
  do {
    while( true ) {
      pcVar2 = (char *)std::__cxx11::string::front();
      bVar6 = false;
      if (*pcVar2 == '(') {
        pcVar2 = (char *)std::__cxx11::string::back();
        bVar6 = *pcVar2 == ')';
      }
      if (!bVar6) {
        return;
      }
      lVar3 = std::__cxx11::string::find_first_of((char)local_10,0x29);
      lVar4 = std::__cxx11::string::size();
      if (lVar3 != lVar4 + -1) break;
      std::__cxx11::string::pop_back();
      psVar1 = local_10;
      local_20._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_18,&local_20);
      uStack_28 = std::__cxx11::string::erase(psVar1,local_18);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        return;
      }
    }
    ii._4_4_ = 1;
    for (local_38 = 1; uVar5 = local_38, lVar3 = std::__cxx11::string::size(), uVar5 < lVar3 - 1U;
        local_38 = local_38 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
      if (*pcVar2 == '(') {
        ii._4_4_ = ii._4_4_ + 1;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
      if ((*pcVar2 == ')') && (ii._4_4_ = ii._4_4_ + -1, ii._4_4_ == 0)) {
        return;
      }
    }
    if (ii._4_4_ != 1) {
      return;
    }
    std::__cxx11::string::pop_back();
    psVar1 = local_10;
    local_48._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
    std::__cxx11::string::erase(psVar1,local_40);
  } while( true );
}

Assistant:

static void removeOuterParenthesis(std::string& ustring)
{
    while (ustring.front() == '(' && ustring.back() == ')') {
        // simple case
        if (ustring.find_first_of(')', 1) == ustring.size() - 1) {
            ustring.pop_back();
            ustring.erase(ustring.begin());
            if (ustring.empty()) {
                return;
            }
            continue;
        }
        int open = 1;
        for (size_t ii = 1; ii < ustring.size() - 1; ++ii) {
            if (ustring[ii] == '(') {
                ++open;
            }
            if (ustring[ii] == ')') {
                --open;
                if (open == 0) {
                    return;
                }
            }
        }
        if (open == 1) {
            ustring.pop_back();
            ustring.erase(ustring.begin());
        } else {
            return;
        }
    }
}